

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O1

vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *
cfd::TransactionContext::CheckMultisig
          (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *__return_storage_ptr__,
          vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_list,
          Script *redeem_script)

{
  pointer pSVar1;
  bool bVar2;
  int iVar3;
  iterator __position;
  CfdException *pCVar4;
  pointer pSVar5;
  bool bVar6;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *signature_list;
  string pubkey_hex;
  Pubkey related_pubkey;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_params;
  SignParameter sign_param;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  string local_160;
  CfdSourceLocation local_140;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> local_128;
  undefined1 local_110 [32];
  pointer local_f0;
  pointer local_e0;
  undefined **local_c8;
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  Script *local_98;
  Pubkey *local_90;
  Pubkey *local_88;
  Pubkey local_80;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_68;
  string local_50;
  
  pSVar5 = (sign_list->super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (sign_list->super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if ((pSVar5 == pSVar1) ||
     (0xf < (ulong)(((long)pSVar1 - (long)pSVar5 >> 3) * -0x1111111111111111))) {
    local_110._0_8_ = "cfd_transaction.cpp";
    local_110._8_4_ = 0x2dc;
    local_110._16_8_ = "CheckMultisig";
    core::logger::log<unsigned_int_const&>
              ((CfdSourceLocation *)local_110,kCfdLogLevelWarning,
               "Failed to CheckMultisig. sign array is \'1 - {}\'.",&kMaximumMultisigKeyNum);
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_110._0_8_ = local_110 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_110,"Value out of range. sign array length fail.","");
    core::CfdException::CfdException(pCVar4,kCfdOutOfRangeError,(string *)local_110);
    __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_98 = redeem_script;
  core::ScriptUtil::ExtractPubkeysFromMultisigScript(&local_68,redeem_script,(uint32_t *)0x0);
  (__return_storage_ptr__->
  super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector(&local_128,sign_list)
  ;
  local_90 = local_68.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (local_68.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_68.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_88 = local_68.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      core::Pubkey::GetHex_abi_cxx11_
                (&local_160,
                 local_68.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      __position._M_current =
           local_128.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
           _M_impl.super__Vector_impl_data._M_start;
      while (__position._M_current !=
             local_128.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
             _M_impl.super__Vector_impl_data._M_finish) {
        SignParameter::SignParameter((SignParameter *)local_110,__position._M_current);
        SignParameter::GetRelatedPubkey((Pubkey *)&local_140,(SignParameter *)local_110);
        bVar2 = core::Pubkey::IsValid((Pubkey *)&local_140);
        bVar6 = true;
        if (bVar2) {
          core::Pubkey::GetHex_abi_cxx11_(&local_50,(Pubkey *)&local_140);
          if (local_50._M_string_length == local_160._M_string_length) {
            if (local_50._M_string_length == 0) {
              bVar6 = false;
            }
            else {
              iVar3 = bcmp(local_50._M_dataplus._M_p,local_160._M_dataplus._M_p,
                           local_50._M_string_length);
              bVar6 = iVar3 != 0;
            }
          }
        }
        if ((bVar2) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2)) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (bVar6) {
          __position._M_current = __position._M_current + 1;
        }
        else {
          __position = std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::
                       _M_erase(&local_128,__position);
          std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
                    (__return_storage_ptr__,(SignParameter *)local_110);
        }
        if (local_140.filename != (char *)0x0) {
          operator_delete(local_140.filename,(long)local_140.funcname - (long)local_140.filename);
        }
        local_c8 = &PTR__ScriptOperator_0087c308;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_p != &local_a8) {
          operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
        }
        if (local_f0 != (pointer)0x0) {
          operator_delete(local_f0,(long)local_e0 - (long)local_f0);
        }
        if ((pointer)local_110._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_110._0_8_,local_110._16_8_ - local_110._0_8_);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      local_68.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
      super__Vector_impl_data._M_start = local_88 + 1;
    } while (local_68.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
             _M_impl.super__Vector_impl_data._M_start != local_90);
  }
  if (local_128.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_128.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar5 = local_128.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      SignParameter::GetRelatedPubkey((Pubkey *)local_110,pSVar5);
      bVar6 = core::Pubkey::IsValid((Pubkey *)local_110);
      if ((pointer)local_110._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ - local_110._0_8_);
      }
      if (bVar6) {
        local_140.filename = "cfd_transaction.cpp";
        local_140.line = 0x2fe;
        local_140.funcname = "CheckMultisig";
        SignParameter::GetRelatedPubkey(&local_80,pSVar5);
        core::Pubkey::GetHex_abi_cxx11_((string *)local_110,&local_80);
        core::Script::GetHex_abi_cxx11_(&local_160,local_98);
        core::logger::log<std::__cxx11::string&,std::__cxx11::string_const&>
                  (&local_140,kCfdLogLevelWarning,
                   "Failed to CheckMultisig. Missing related pubkey in script.: relatedPubkey={}, script={}"
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                   &local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
          operator_delete((void *)local_110._0_8_,(ulong)(local_110._16_8_ + 1));
        }
        if (local_80.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_80.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_80.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        local_110._0_8_ = local_110 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_110,
                   "Missing related pubkey in script. Check your signature and pubkey pair.","");
        core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_110);
        __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
                (__return_storage_ptr__,pSVar5);
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != local_128.
                       super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&local_128);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::vector<SignParameter> TransactionContext::CheckMultisig(
    const std::vector<SignParameter>& sign_list, const Script& redeem_script) {
  // check signData (too much data)
  if (sign_list.empty() || (sign_list.size() > kMaximumMultisigKeyNum)) {
    warn(
        CFD_LOG_SOURCE, "Failed to CheckMultisig. sign array is '1 - {}'.",
        kMaximumMultisigKeyNum);
    throw CfdException(
        CfdError::kCfdOutOfRangeError,
        "Value out of range. sign array length fail.");
  }

  // check multisig format and extract pubkey.
  std::vector<Pubkey> pubkeys =
      ScriptUtil::ExtractPubkeysFromMultisigScript(redeem_script);

  std::vector<SignParameter> signature_list;
  std::vector<SignParameter> sign_params = sign_list;
  for (const Pubkey& pubkey : pubkeys) {
    std::string pubkey_hex = pubkey.GetHex();
    for (auto itr = sign_params.begin(); itr != sign_params.end();) {
      SignParameter sign_param = *itr;
      Pubkey related_pubkey = sign_param.GetRelatedPubkey();
      if ((!related_pubkey.IsValid()) ||
          (related_pubkey.GetHex() != pubkey_hex)) {
        ++itr;
        continue;
      }

      itr = sign_params.erase(itr);
      signature_list.push_back(sign_param);
    }
  }

  // set the others to signature data
  for (const auto& sign_param : sign_params) {
    // related pubkey not found in script
    if (sign_param.GetRelatedPubkey().IsValid()) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to CheckMultisig. Missing related pubkey"
          " in script.: relatedPubkey={}, script={}",
          sign_param.GetRelatedPubkey().GetHex(), redeem_script.GetHex());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Missing related pubkey in script."
          " Check your signature and pubkey pair.");
    }
    signature_list.push_back(sign_param);
  }

  return signature_list;
}